

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void print<char[19],std::__cxx11::string,char[15],int,char[2],vm::Instruction>
               (ostream *out,char (*t) [19],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [15],int *args_2,char (*args_3) [2],Instruction *args_4)

{
  std::operator<<(out,*t);
  std::operator<<(out," ");
  print<std::__cxx11::string,char[15],int,char[2],vm::Instruction>
            (out,args,args_1,args_2,args_3,args_4);
  return;
}

Assistant:

inline void print(std::ostream& out, const T& t, const Args&... args) {
    print(out, t);
	print(out, " ");
    print(out, args...);
}